

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O0

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<double>_>::writeData
          (AccumulatorView<OpenMD::Utils::Accumulator<double>_> *this,ostream *stream,
          string *errorMessage,DataHandling dataHandling)

{
  uint uVar1;
  size_t sVar2;
  undefined8 uVar3;
  ostream *this_00;
  undefined4 in_ECX;
  ostream *in_RSI;
  long in_RDI;
  size_t count;
  RealType dat;
  double local_28;
  
  local_28 = 0.0;
  sVar2 = Accumulator<double>::getCount((Accumulator<double> *)(in_RDI + 8));
  switch(in_ECX) {
  case 0:
    local_28 = Accumulator<double>::getAverage((Accumulator<double> *)(in_RDI + 8));
    break;
  case 1:
    local_28 = Accumulator<double>::getLastValue((Accumulator<double> *)(in_RDI + 8));
    break;
  case 2:
    local_28 = Accumulator<double>::getMax((Accumulator<double> *)(in_RDI + 8));
    break;
  case 3:
    local_28 = Accumulator<double>::getMin((Accumulator<double> *)(in_RDI + 8));
    break;
  case 4:
    local_28 = Accumulator<double>::getTotal((Accumulator<double> *)(in_RDI + 8));
  }
  uVar1 = std::isinf(local_28);
  if (((uVar1 & 1) == 0) && (uVar1 = std::isnan(local_28), (uVar1 & 1) == 0)) {
    if (sVar2 == 0) {
      std::operator<<(in_RSI,"\t");
    }
    else {
      this_00 = std::operator<<(in_RSI,"\t");
      std::ostream::operator<<(this_00,local_28);
    }
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"%s",uVar3);
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

void writeData(std::ostream& stream, const std::string& errorMessage,
                   DataHandling dataHandling) const override {
      RealType dat {};
      std::size_t count = RealAccumulator::getCount();

      switch (dataHandling) {
      case DataHandling::Average:
        dat = RealAccumulator::getAverage();
        break;
      case DataHandling::Last:
        dat = RealAccumulator::getLastValue();
        break;
      case DataHandling::Max:
        dat = RealAccumulator::getMax();
        break;
      case DataHandling::Min:
        dat = RealAccumulator::getMin();
        break;
      case DataHandling::Total:
        dat = RealAccumulator::getTotal();
        break;
      default:
        break;
      }

      if (std::isinf(dat) || std::isnan(dat)) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                 errorMessage.c_str());
        painCave.isFatal = 1;
        simError();
      } else {
        if (count == 0)
          stream << "\t";
        else
          stream << "\t" << dat;
      }
    }